

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locmap.cpp
# Opt level: O2

int32_t uprv_convertToPosix_63
                  (uint32_t hostid,char *posixID,int32_t posixIDCapacity,UErrorCode *status)

{
  uint *puVar1;
  uint *puVar2;
  char *__s;
  UErrorCode UVar3;
  int32_t iVar4;
  size_t sVar5;
  long lVar6;
  uint *puVar7;
  long lVar8;
  uint *puVar9;
  int32_t iVar10;
  
  iVar10 = -1;
  UVar3 = U_ILLEGAL_ARGUMENT_ERROR;
  lVar6 = -0x10;
  do {
    lVar8 = lVar6;
    if (lVar8 + 0x10 == 0x8d0) goto LAB_001c38a2;
    puVar2 = *(uint **)((long)&gPosixIDmap[1].regionMaps + lVar8);
    lVar6 = lVar8 + 0x10;
  } while ((hostid & 0x3ff) != *puVar2);
  lVar6 = (ulong)*(uint *)((long)&gPosixIDmap[1].numRegions + lVar8) + 1;
  puVar7 = puVar2 + -4;
  do {
    lVar6 = lVar6 + -1;
    puVar9 = puVar2;
    if (lVar6 == 0) break;
    puVar9 = puVar7 + 4;
    puVar1 = puVar7 + 4;
    puVar7 = puVar9;
  } while (*puVar1 != hostid);
  __s = *(char **)(puVar9 + 2);
  if (__s != (char *)0x0) {
    sVar5 = strlen(__s);
    iVar10 = (int32_t)sVar5;
    iVar4 = posixIDCapacity;
    if (iVar10 < posixIDCapacity) {
      iVar4 = iVar10;
    }
    memcpy(posixID,__s,(long)iVar4);
    if (iVar10 < posixIDCapacity) {
      posixID[iVar10] = '\0';
      UVar3 = U_ZERO_ERROR;
      if (*status != U_STRING_NOT_TERMINATED_WARNING) {
        return iVar10;
      }
    }
    else {
      UVar3 = U_BUFFER_OVERFLOW_ERROR;
      if (iVar10 == posixIDCapacity) {
        UVar3 = U_STRING_NOT_TERMINATED_WARNING;
      }
    }
  }
LAB_001c38a2:
  *status = UVar3;
  return iVar10;
}

Assistant:

U_CAPI int32_t
uprv_convertToPosix(uint32_t hostid, char *posixID, int32_t posixIDCapacity, UErrorCode* status)
{
    uint16_t langID;
    uint32_t localeIndex;
    UBool bLookup = TRUE;
    const char *pPosixID = NULL;

#ifdef USE_WINDOWS_LCID_MAPPING_API
    char locName[LOCALE_NAME_MAX_LENGTH] = {};      // ICU name can't be longer than Windows name

    // Note: Windows primary lang ID 0x92 in LCID is used for Central Kurdish and
    // GetLocaleInfo() maps such LCID to "ku". However, CLDR uses "ku" for
    // Northern Kurdish and "ckb" for Central Kurdish. For this reason, we cannot
    // use the Windows API to resolve locale ID for this specific case.
    if ((hostid & 0x3FF) != 0x92) {
        int32_t tmpLen = 0;
        UChar windowsLocaleName[LOCALE_NAME_MAX_LENGTH];  // ULOC_FULLNAME_CAPACITY > LOCALE_NAME_MAX_LENGTH

        // Note: LOCALE_ALLOW_NEUTRAL_NAMES was enabled in Windows7+, prior versions did not handle neutral (no-region) locale names.
        tmpLen = LCIDToLocaleName(hostid, (PWSTR)windowsLocaleName, UPRV_LENGTHOF(windowsLocaleName), LOCALE_ALLOW_NEUTRAL_NAMES);
        if (tmpLen > 1) {
            int32_t i = 0;
            // Only need to look up in table if have _, eg for de-de_phoneb type alternate sort.
            bLookup = FALSE;
            for (i = 0; i < UPRV_LENGTHOF(locName); i++)
            {
                locName[i] = (char)(windowsLocaleName[i]);

                // Windows locale name may contain sorting variant, such as "es-ES_tradnl".
                // In such cases, we need special mapping data found in the hardcoded table
                // in this source file.
                if (windowsLocaleName[i] == L'_')
                {
                    // Keep the base locale, without variant
                    // TODO: Should these be mapped from _phoneb to @collation=phonebook, etc.?
                    locName[i] = '\0';
                    tmpLen = i;
                    bLookup = TRUE;
                    break;
                }
                else if (windowsLocaleName[i] == L'-')
                {
                    // Windows names use -, ICU uses _
                    locName[i] = '_';
                }
                else if (windowsLocaleName[i] == L'\0')
                {
                    // No point in doing more work than necessary
                    break;
                }
            }
            // TODO: Need to understand this better, why isn't it an alias?
            FIX_LANGUAGE_ID_TAG(locName, tmpLen);
            pPosixID = locName;
        }
    }
#endif // USE_WINDOWS_LCID_MAPPING_API

    if (bLookup) {
        const char *pCandidate = NULL;
        langID = LANGUAGE_LCID(hostid);

        for (localeIndex = 0; localeIndex < gLocaleCount; localeIndex++) {
            if (langID == gPosixIDmap[localeIndex].regionMaps->hostID) {
                pCandidate = getPosixID(&gPosixIDmap[localeIndex], hostid);
                break;
            }
        }

        /* On Windows, when locale name has a variant, we still look up the hardcoded table.
           If a match in the hardcoded table is longer than the Windows locale name without
           variant, we use the one as the result */
        if (pCandidate && (pPosixID == NULL || uprv_strlen(pCandidate) > uprv_strlen(pPosixID))) {
            pPosixID = pCandidate;
        }
    }

    if (pPosixID) {
        int32_t resLen = static_cast<int32_t>(uprv_strlen(pPosixID));
        int32_t copyLen = resLen <= posixIDCapacity ? resLen : posixIDCapacity;
        uprv_memcpy(posixID, pPosixID, copyLen);
        if (resLen < posixIDCapacity) {
            posixID[resLen] = 0;
            if (*status == U_STRING_NOT_TERMINATED_WARNING) {
                *status = U_ZERO_ERROR;
            }
        } else if (resLen == posixIDCapacity) {
            *status = U_STRING_NOT_TERMINATED_WARNING;
        } else {
            *status = U_BUFFER_OVERFLOW_ERROR;
        }
        return resLen;
    }

    /* no match found */
    *status = U_ILLEGAL_ARGUMENT_ERROR;
    return -1;
}